

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_sit.cpp
# Opt level: O3

void ucol_sit_calculateWholeLocale(CollatorSpec *s)

{
  char *__dest;
  size_t sVar1;
  
  if (s->locale[0] == '\0') {
    __dest = s->locale;
    strcat(__dest,(char *)s);
    if (s->locElements[1][0] != '\0') {
      sVar1 = strlen(__dest);
      (__dest + sVar1)[0] = '_';
      (__dest + sVar1)[1] = '\0';
      strcat(__dest,s->locElements[1]);
    }
    if (s->locElements[2][0] == '\0') {
      if (s->locElements[3][0] != '\0') {
        sVar1 = strlen(__dest);
        (__dest + sVar1)[0] = '_';
        (__dest + sVar1)[1] = '\0';
      }
    }
    else {
      sVar1 = strlen(__dest);
      (__dest + sVar1)[0] = '_';
      (__dest + sVar1)[1] = '\0';
      strcat(__dest,s->locElements[2]);
    }
    if (s->locElements[3][0] != '\0') {
      sVar1 = strlen(__dest);
      (__dest + sVar1)[0] = '_';
      (__dest + sVar1)[1] = '\0';
      strcat(__dest,s->locElements[3]);
    }
    if (s->locElements[4][0] != '\0') {
      sVar1 = strlen(__dest);
      builtin_strncpy(__dest + sVar1,"@collation=",0xc);
      strcat(__dest,s->locElements[4]);
    }
    if (s->locElements[5][0] != '\0') {
      sVar1 = strlen(__dest);
      builtin_strncpy(__dest + sVar1,"@sp=",5);
      strcat(__dest,s->locElements[5]);
      return;
    }
  }
  return;
}

Assistant:

static void
ucol_sit_calculateWholeLocale(CollatorSpec *s) {
    // put the locale together, unless we have a done
    // locale
    if(s->locale[0] == 0) {
        // first the language
        uprv_strcat(s->locale, s->locElements[UCOL_SIT_LANGUAGE]);
        // then the script, if present
        if(*(s->locElements[UCOL_SIT_SCRIPT])) {
            uprv_strcat(s->locale, "_");
            uprv_strcat(s->locale, s->locElements[UCOL_SIT_SCRIPT]);
        }
        // then the region, if present
        if(*(s->locElements[UCOL_SIT_REGION])) {
            uprv_strcat(s->locale, "_");
            uprv_strcat(s->locale, s->locElements[UCOL_SIT_REGION]);
        } else if(*(s->locElements[UCOL_SIT_VARIANT])) { // if there is a variant, we need an underscore
            uprv_strcat(s->locale, "_");
        }
        // add variant, if there
        if(*(s->locElements[UCOL_SIT_VARIANT])) {
            uprv_strcat(s->locale, "_");
            uprv_strcat(s->locale, s->locElements[UCOL_SIT_VARIANT]);
        }

        // if there is a collation keyword, add that too
        if(*(s->locElements[UCOL_SIT_KEYWORD])) {
            uprv_strcat(s->locale, collationKeyword);
            uprv_strcat(s->locale, s->locElements[UCOL_SIT_KEYWORD]);
        }

        // if there is a provider keyword, add that too
        if(*(s->locElements[UCOL_SIT_PROVIDER])) {
            uprv_strcat(s->locale, providerKeyword);
            uprv_strcat(s->locale, s->locElements[UCOL_SIT_PROVIDER]);
        }
    }
}